

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.h
# Opt level: O0

void __thiscall ShImmediateData::reset(ShImmediateData *this)

{
  bool bVar1;
  Expression local_28;
  ShImmediateData *local_10;
  ShImmediateData *this_local;
  
  (this->primary).type = None;
  local_10 = this;
  bVar1 = Expression::isLoaded(&(this->primary).expression);
  if (bVar1) {
    memset(&local_28,0,0x18);
    Expression::Expression(&local_28);
    Expression::operator=(&(this->primary).expression,&local_28);
    Expression::~Expression(&local_28);
  }
  return;
}

Assistant:

void reset()
	{
		primary.type = ShImmediateType::None;
		if (primary.expression.isLoaded())
			primary.expression = Expression();
	}